

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::GetFullExtensionName_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FieldDescriptor *descriptor)

{
  Descriptor *pDVar1;
  FileDescriptor *descriptor_00;
  Descriptor *descriptor_01;
  AlphaNum *in_R8;
  string local_e8;
  string local_c8;
  AlphaNum local_a8;
  size_type local_78;
  pointer local_70;
  AlphaNum local_48;
  
  pDVar1 = FieldDescriptor::extension_scope((FieldDescriptor *)this);
  if (pDVar1 == (Descriptor *)0x0) {
    GetExtensionClassUnqualifiedName_abi_cxx11_(&local_c8,*(csharp **)(this + 0x10),descriptor_00);
    local_78 = local_c8._M_string_length;
    local_70 = local_c8._M_dataplus._M_p;
    local_a8.piece_ = absl::lts_20250127::NullSafeStringView(".");
    GetPropertyName_abi_cxx11_(&local_e8,this,(FieldDescriptor *)local_a8.piece_._M_str);
    local_48.piece_._M_len = local_e8._M_string_length;
    local_48.piece_._M_str = local_e8._M_dataplus._M_p;
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_78,&local_a8,&local_48,in_R8);
  }
  else {
    pDVar1 = FieldDescriptor::extension_scope((FieldDescriptor *)this);
    GetClassName_abi_cxx11_(&local_c8,(csharp *)pDVar1,descriptor_01);
    local_78 = local_c8._M_string_length;
    local_70 = local_c8._M_dataplus._M_p;
    local_a8.piece_ = absl::lts_20250127::NullSafeStringView(".Extensions.");
    GetPropertyName_abi_cxx11_(&local_e8,this,(FieldDescriptor *)local_a8.piece_._M_str);
    local_48.piece_._M_len = local_e8._M_string_length;
    local_48.piece_._M_str = local_e8._M_dataplus._M_p;
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_78,&local_a8,&local_48,in_R8);
  }
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFullExtensionName(const FieldDescriptor* descriptor) {
  if (descriptor->extension_scope()) {
    return absl::StrCat(GetClassName(descriptor->extension_scope()),
                        ".Extensions.", GetPropertyName(descriptor));
  }

  return absl::StrCat(GetExtensionClassUnqualifiedName(descriptor->file()), ".",
                      GetPropertyName(descriptor));
}